

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressBlock_lazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  uint uVar2;
  undefined8 uVar3;
  ZSTD_matchState_t *pZVar4;
  U32 lowestValid_1;
  int iVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  BYTE *pBVar10;
  seqDef *psVar11;
  U32 UVar12;
  BYTE *pBVar13;
  BYTE *pBVar14;
  int *piVar15;
  long lVar16;
  BYTE *litEnd;
  ulong uVar17;
  int *piVar18;
  uint uVar19;
  U32 UVar20;
  uint uVar21;
  U32 UVar22;
  BYTE *litEnd_1;
  ulong uVar23;
  U32 UVar24;
  ulong uVar25;
  size_t ofbCandidate;
  U32 maxDistance;
  BYTE *litLimit_w;
  size_t local_d0;
  ulong local_c8;
  BYTE *local_c0;
  int local_b8;
  uint local_b4;
  ulong local_b0;
  BYTE *local_a8;
  uint local_a0;
  U32 local_9c;
  int *local_98;
  int *local_90;
  BYTE *local_88;
  seqStore_t *local_80;
  ZSTD_matchState_t *local_78;
  BYTE *local_70;
  BYTE *local_68;
  int *local_60;
  ulong local_58;
  U32 local_4c;
  int *local_48;
  U32 *local_40;
  BYTE *local_38;
  
  local_c0 = (BYTE *)((long)src + srcSize);
  local_98 = (int *)((long)src + (srcSize - 8));
  local_70 = (ms->window).base;
  local_a8 = (ms->window).dictBase;
  uVar21 = (ms->window).dictLimit;
  local_b0 = (ulong)uVar21;
  local_88 = local_70 + local_b0;
  uVar6 = (ms->window).lowLimit;
  uVar7 = (ms->cParams).windowLog;
  uVar2 = (ms->cParams).minMatch;
  uVar19 = 6;
  if (uVar2 < 6) {
    uVar19 = uVar2;
  }
  local_a0 = 4;
  if (4 < uVar19) {
    local_a0 = uVar19;
  }
  UVar22 = *rep;
  UVar24 = rep[1];
  ms->lazySkipping = 0;
  piVar18 = (int *)((ulong)(local_88 == (BYTE *)src) + (long)src);
  local_40 = rep;
  if (piVar18 < local_98) {
    local_68 = local_a8 + local_b0;
    local_38 = local_a8 + uVar6;
    local_b4 = 1 << ((byte)uVar7 & 0x1f);
    local_b8 = uVar21 - 1;
    local_60 = (int *)(local_c0 + -0x20);
    local_80 = seqStore;
    local_78 = ms;
    do {
      uVar21 = (int)piVar18 - (int)local_70;
      local_58 = (ulong)uVar21;
      iVar5 = uVar21 + 1;
      UVar20 = (ms->window).lowLimit;
      UVar12 = iVar5 - local_b4;
      if (iVar5 - UVar20 <= local_b4) {
        UVar12 = UVar20;
      }
      if (ms->loadedDictEnd != 0) {
        UVar12 = UVar20;
      }
      uVar6 = iVar5 - UVar22;
      pBVar13 = local_70;
      if (uVar6 < (uint)local_b0) {
        pBVar13 = local_a8;
      }
      local_9c = UVar22;
      if (local_b8 - uVar6 < 3) {
LAB_01d3de18:
        uVar17 = 0;
      }
      else {
        uVar17 = 0;
        if (UVar22 <= (uVar21 - UVar12) + 1) {
          if (*(int *)((long)piVar18 + 1) != *(int *)(pBVar13 + uVar6)) goto LAB_01d3de18;
          pBVar10 = local_c0;
          if (uVar6 < (uint)local_b0) {
            pBVar10 = local_68;
          }
          sVar8 = ZSTD_count_2segments
                            ((BYTE *)((long)piVar18 + 5),(BYTE *)((long)(pBVar13 + uVar6) + 4),
                             local_c0,pBVar10,local_88);
          uVar17 = sVar8 + 4;
        }
      }
      local_d0 = 999999999;
      if (local_a0 == 6) {
        uVar9 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)piVar18,local_c0,&local_d0);
      }
      else if (local_a0 == 5) {
        uVar9 = ZSTD_HcFindBestMatch_extDict_5(ms,(BYTE *)piVar18,local_c0,&local_d0);
      }
      else {
        uVar9 = ZSTD_HcFindBestMatch_extDict_4(ms,(BYTE *)piVar18,local_c0,&local_d0);
      }
      uVar25 = uVar17;
      if (uVar17 < uVar9) {
        uVar25 = uVar9;
      }
      if (uVar25 < 4) {
        uVar17 = (long)piVar18 - (long)src;
        piVar18 = (int *)((long)piVar18 + (uVar17 >> 8) + 1);
        ms->lazySkipping = (uint)(0x8ff < uVar17);
        UVar22 = local_9c;
      }
      else {
        local_90 = piVar18;
        uVar23 = local_d0;
        if (uVar9 <= uVar17) {
          local_90 = (int *)((long)piVar18 + 1);
          uVar23 = 1;
        }
        uVar17 = local_58;
        local_c8 = uVar25;
        local_4c = UVar24;
        local_48 = (int *)src;
        if (piVar18 < local_98) {
          do {
            pZVar4 = local_78;
            pBVar13 = local_c0;
            piVar15 = (int *)((long)piVar18 + 1);
            uVar21 = (int)uVar17 + 1;
            local_58 = uVar17;
            if (uVar23 == 0) {
              uVar23 = 0;
            }
            else {
              UVar22 = (local_78->window).lowLimit;
              UVar24 = uVar21 - local_b4;
              if (uVar21 - UVar22 <= local_b4) {
                UVar24 = UVar22;
              }
              if (local_78->loadedDictEnd != 0) {
                UVar24 = UVar22;
              }
              uVar6 = uVar21 - local_9c;
              pBVar10 = local_70;
              if (uVar6 < (uint)local_b0) {
                pBVar10 = local_a8;
              }
              if (((2 < local_b8 - uVar6) && (local_9c <= uVar21 - UVar24)) &&
                 (*piVar15 == *(int *)(pBVar10 + uVar6))) {
                pBVar14 = local_c0;
                if (uVar6 < (uint)local_b0) {
                  pBVar14 = local_68;
                }
                sVar8 = ZSTD_count_2segments
                                  ((BYTE *)((long)piVar18 + 5),(BYTE *)((long)(pBVar10 + uVar6) + 4)
                                   ,local_c0,pBVar14,local_88);
                if (sVar8 < 0xfffffffffffffffc) {
                  uVar6 = 0x1f;
                  if ((uint)uVar23 != 0) {
                    for (; (uint)uVar23 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                    }
                  }
                  if ((int)((uVar6 ^ 0x1f) + (int)local_c8 * 3 + -0x1e) < (int)(sVar8 + 4) * 3) {
                    uVar23 = 1;
                    local_c8 = sVar8 + 4;
                    local_90 = piVar15;
                  }
                }
              }
            }
            local_d0 = 999999999;
            if (local_a0 == 6) {
              uVar17 = ZSTD_HcFindBestMatch_extDict_6(pZVar4,(BYTE *)piVar15,pBVar13,&local_d0);
            }
            else if (local_a0 == 5) {
              uVar17 = ZSTD_HcFindBestMatch_extDict_5(pZVar4,(BYTE *)piVar15,pBVar13,&local_d0);
            }
            else {
              uVar17 = ZSTD_HcFindBestMatch_extDict_4(pZVar4,(BYTE *)piVar15,pBVar13,&local_d0);
            }
            pZVar4 = local_78;
            pBVar13 = local_c0;
            uVar6 = (uint)uVar23;
            if (uVar17 < 4) {
LAB_01d3e03d:
              uVar25 = local_c8;
              if (local_98 <= piVar15) break;
              piVar15 = (int *)((long)piVar18 + 2);
              uVar21 = (int)local_58 + 2;
              if (uVar23 == 0) {
                uVar23 = 0;
              }
              else {
                UVar22 = (local_78->window).lowLimit;
                UVar24 = uVar21 - local_b4;
                if (uVar21 - UVar22 <= local_b4) {
                  UVar24 = UVar22;
                }
                if (local_78->loadedDictEnd != 0) {
                  UVar24 = UVar22;
                }
                uVar7 = uVar21 - local_9c;
                pBVar10 = local_70;
                if (uVar7 < (uint)local_b0) {
                  pBVar10 = local_a8;
                }
                if (((2 < local_b8 - uVar7) && (local_9c <= uVar21 - UVar24)) &&
                   (*piVar15 == *(int *)(pBVar10 + uVar7))) {
                  pBVar14 = local_c0;
                  if (uVar7 < (uint)local_b0) {
                    pBVar14 = local_68;
                  }
                  sVar8 = ZSTD_count_2segments
                                    ((BYTE *)((long)piVar18 + 6),
                                     (BYTE *)((long)(pBVar10 + uVar7) + 4),local_c0,pBVar14,local_88
                                    );
                  uVar25 = local_c8;
                  if (sVar8 < 0xfffffffffffffffc) {
                    uVar7 = 0x1f;
                    if (uVar6 != 0) {
                      for (; uVar6 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                      }
                    }
                    if ((int)((uVar7 ^ 0x1f) + (int)local_c8 * 4 + -0x1e) < (int)(sVar8 + 4) * 4) {
                      uVar23 = 1;
                      uVar25 = sVar8 + 4;
                      local_90 = piVar15;
                    }
                  }
                }
              }
              local_d0 = 999999999;
              if (local_a0 == 6) {
                uVar17 = ZSTD_HcFindBestMatch_extDict_6(pZVar4,(BYTE *)piVar15,pBVar13,&local_d0);
              }
              else if (local_a0 == 5) {
                uVar17 = ZSTD_HcFindBestMatch_extDict_5(pZVar4,(BYTE *)piVar15,pBVar13,&local_d0);
              }
              else {
                uVar17 = ZSTD_HcFindBestMatch_extDict_4(pZVar4,(BYTE *)piVar15,pBVar13,&local_d0);
              }
              if (uVar17 < 4) break;
              uVar6 = 0x1f;
              if ((uint)uVar23 != 0) {
                for (; (uint)uVar23 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                }
              }
              iVar5 = 0x1f;
              if ((uint)local_d0 != 0) {
                for (; (uint)local_d0 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                }
              }
              if ((int)uVar17 * 4 - iVar5 <= (int)((uVar6 ^ 0x1f) + (int)uVar25 * 4 + -0x18)) break;
            }
            else {
              uVar7 = 0x1f;
              if (uVar6 != 0) {
                for (; uVar6 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                }
              }
              iVar5 = 0x1f;
              if ((uint)local_d0 != 0) {
                for (; (uint)local_d0 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                }
              }
              if ((int)uVar17 * 4 - iVar5 <= (int)((uVar7 ^ 0x1f) + (int)local_c8 * 4 + -0x1b))
              goto LAB_01d3e03d;
            }
            uVar25 = uVar17;
            uVar17 = (ulong)uVar21;
            piVar18 = piVar15;
            uVar23 = local_d0;
            local_c8 = uVar25;
            local_90 = piVar15;
          } while (piVar15 < local_98);
        }
        piVar18 = local_90;
        UVar22 = local_9c;
        UVar24 = local_4c;
        if (3 < uVar23) {
          pBVar14 = (BYTE *)((long)local_90 + (3 - (long)(local_70 + uVar23)));
          pBVar10 = local_88;
          pBVar13 = local_70;
          if ((uint)pBVar14 < (uint)local_b0) {
            pBVar10 = local_38;
            pBVar13 = local_a8;
          }
          if ((local_48 < local_90) &&
             (uVar17 = (ulong)pBVar14 & 0xffffffff, pBVar10 < pBVar13 + uVar17)) {
            pBVar13 = pBVar13 + uVar17;
            do {
              piVar15 = (int *)((long)piVar18 + -1);
              pBVar13 = pBVar13 + -1;
              if ((*(BYTE *)piVar15 != *pBVar13) ||
                 (uVar25 = uVar25 + 1, piVar18 = piVar15, piVar15 <= local_48)) break;
            } while (pBVar10 < pBVar13);
          }
          UVar22 = (U32)uVar23 - 3;
          UVar24 = local_9c;
        }
        uVar17 = (long)piVar18 - (long)local_48;
        pBVar13 = local_80->lit;
        if (local_60 < piVar18) {
          ZSTD_safecopyLiterals(pBVar13,(BYTE *)local_48,(BYTE *)piVar18,(BYTE *)local_60);
LAB_01d3e29b:
          local_80->lit = local_80->lit + uVar17;
          psVar11 = local_80->sequences;
          if (0xffff < uVar17) {
            local_80->longLengthType = ZSTD_llt_literalLength;
            local_80->longLengthPos =
                 (U32)((ulong)((long)psVar11 - (long)local_80->sequencesStart) >> 3);
          }
        }
        else {
          uVar3 = *(undefined8 *)(local_48 + 2);
          *(undefined8 *)pBVar13 = *(undefined8 *)local_48;
          *(undefined8 *)(pBVar13 + 8) = uVar3;
          pBVar13 = local_80->lit;
          if (0x10 < uVar17) {
            uVar3 = *(undefined8 *)(local_48 + 6);
            *(undefined8 *)(pBVar13 + 0x10) = *(undefined8 *)(local_48 + 4);
            *(undefined8 *)(pBVar13 + 0x18) = uVar3;
            if (0x20 < (long)uVar17) {
              lVar16 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_48 + lVar16 + 0x20);
                uVar3 = puVar1[1];
                pBVar10 = pBVar13 + lVar16 + 0x20;
                *(undefined8 *)pBVar10 = *puVar1;
                *(undefined8 *)(pBVar10 + 8) = uVar3;
                puVar1 = (undefined8 *)((long)local_48 + lVar16 + 0x30);
                uVar3 = puVar1[1];
                *(undefined8 *)(pBVar10 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar10 + 0x18) = uVar3;
                lVar16 = lVar16 + 0x20;
              } while (pBVar10 + 0x20 < pBVar13 + uVar17);
            }
            goto LAB_01d3e29b;
          }
          local_80->lit = pBVar13 + uVar17;
          psVar11 = local_80->sequences;
        }
        ms = local_78;
        psVar11->litLength = (U16)uVar17;
        psVar11->offBase = (U32)uVar23;
        if (0xffff < uVar25 - 3) {
          local_80->longLengthType = ZSTD_llt_matchLength;
          local_80->longLengthPos =
               (U32)((ulong)((long)psVar11 - (long)local_80->sequencesStart) >> 3);
        }
        psVar11->mlBase = (U16)(uVar25 - 3);
        local_80->sequences = psVar11 + 1;
        if (local_78->lazySkipping != 0) {
          local_78->lazySkipping = 0;
        }
        piVar18 = (int *)((long)piVar18 + uVar25);
        src = piVar18;
        if (piVar18 <= local_98) {
          do {
            UVar12 = UVar22;
            iVar5 = (int)piVar18 - (int)local_70;
            UVar22 = (ms->window).lowLimit;
            UVar20 = iVar5 - local_b4;
            if (iVar5 - UVar22 <= local_b4) {
              UVar20 = UVar22;
            }
            if (ms->loadedDictEnd != 0) {
              UVar20 = UVar22;
            }
            uVar21 = iVar5 - UVar24;
            pBVar13 = local_70;
            if (uVar21 < (uint)local_b0) {
              pBVar13 = local_a8;
            }
            src = piVar18;
            UVar22 = UVar12;
            if (((local_b8 - uVar21 < 3) || (iVar5 - UVar20 < UVar24)) ||
               (*piVar18 != *(int *)(pBVar13 + uVar21))) break;
            pBVar10 = local_c0;
            if (uVar21 < (uint)local_b0) {
              pBVar10 = local_68;
            }
            sVar8 = ZSTD_count_2segments
                              ((BYTE *)(piVar18 + 1),(BYTE *)((long)(pBVar13 + uVar21) + 4),local_c0
                               ,pBVar10,local_88);
            pBVar13 = local_80->lit;
            if (local_60 < piVar18) {
              ZSTD_safecopyLiterals(pBVar13,(BYTE *)piVar18,(BYTE *)piVar18,(BYTE *)local_60);
            }
            else {
              uVar3 = *(undefined8 *)(piVar18 + 2);
              *(undefined8 *)pBVar13 = *(undefined8 *)piVar18;
              *(undefined8 *)(pBVar13 + 8) = uVar3;
            }
            psVar11 = local_80->sequences;
            psVar11->litLength = 0;
            psVar11->offBase = 1;
            if (0xffff < sVar8 + 1) {
              local_80->longLengthType = ZSTD_llt_matchLength;
              local_80->longLengthPos =
                   (U32)((ulong)((long)psVar11 - (long)local_80->sequencesStart) >> 3);
            }
            psVar11->mlBase = (U16)(sVar8 + 1);
            local_80->sequences = psVar11 + 1;
            piVar18 = (int *)((long)piVar18 + sVar8 + 4);
            src = piVar18;
            UVar22 = UVar24;
            UVar24 = UVar12;
          } while (piVar18 <= local_98);
        }
      }
    } while (piVar18 < local_98);
  }
  *local_40 = UVar22;
  local_40[1] = UVar24;
  return (long)local_c0 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 2);
}